

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

QByteArray * __thiscall
QByteArray::toPercentEncoding
          (QByteArray *__return_storage_ptr__,QByteArray *this,QByteArray *exclude,
          QByteArray *include,char percent)

{
  byte bVar1;
  Data *pDVar2;
  size_t sVar3;
  bool bVar4;
  void *pvVar5;
  char *pcVar6;
  byte *pbVar7;
  char *pcVar8;
  long lVar9;
  byte *pbVar10;
  
  bVar4 = isNull(this);
  if (bVar4) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    lVar9 = (this->d).size;
    if (lVar9 == 0) {
      pcVar6 = (this->d).ptr;
      if (pcVar6 == (char *)0x0) {
        pcVar6 = &_empty;
      }
      QByteArray(__return_storage_ptr__,pcVar6,0);
    }
    else {
      pDVar2 = (this->d).d;
      (__return_storage_ptr__->d).d = pDVar2;
      pbVar10 = (byte *)(this->d).ptr;
      (__return_storage_ptr__->d).ptr = (char *)pbVar10;
      (__return_storage_ptr__->d).size = lVar9;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        lVar9 = (this->d).size;
        if (lVar9 == 0) {
          return __return_storage_ptr__;
        }
        pbVar10 = (byte *)(this->d).ptr;
      }
      pbVar7 = pbVar10 + lVar9;
      pcVar6 = (char *)0x0;
      lVar9 = 0;
      do {
        bVar1 = *pbVar10;
        if (bVar1 == percent) {
LAB_0030482f:
          if (pcVar6 == (char *)0x0) {
            resize(__return_storage_ptr__,(this->d).size * 3);
            pDVar2 = (__return_storage_ptr__->d).d;
            if ((pDVar2 == (Data *)0x0) ||
               (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
              reallocData(__return_storage_ptr__,(__return_storage_ptr__->d).size,KeepSize);
            }
            pcVar6 = (__return_storage_ptr__->d).ptr;
          }
          pcVar6[lVar9] = percent;
          pcVar6[lVar9 + 1] = "0123456789ABCDEF"[bVar1 >> 4];
          pcVar6[lVar9 + 2] = "0123456789ABCDEF"[bVar1 & 0xf];
          lVar9 = lVar9 + 3;
        }
        else {
          if ((((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) &&
              (1 < bVar1 - 0x2d)) && ((bVar1 != 0x5f && (bVar1 != 0x7e)))) {
            sVar3 = (exclude->d).size;
            if (sVar3 != 0) {
              pcVar8 = (exclude->d).ptr;
              if (pcVar8 == (char *)0x0) {
                pcVar8 = &_empty;
              }
              pvVar5 = memchr(pcVar8,(int)(char)bVar1,sVar3);
              if (pvVar5 != (void *)0x0) goto LAB_003047f5;
            }
            goto LAB_0030482f;
          }
LAB_003047f5:
          sVar3 = (include->d).size;
          if (sVar3 != 0) {
            pcVar8 = (include->d).ptr;
            if (pcVar8 == (char *)0x0) {
              pcVar8 = &_empty;
            }
            pvVar5 = memchr(pcVar8,(int)(char)bVar1,sVar3);
            if (pvVar5 != (void *)0x0) goto LAB_0030482f;
          }
          if (pcVar6 != (char *)0x0) {
            pcVar6[lVar9] = bVar1;
          }
          lVar9 = lVar9 + 1;
        }
        pbVar10 = pbVar10 + 1;
      } while (pbVar10 != pbVar7);
      if ((pcVar6 != (char *)0x0) && (lVar9 < (__return_storage_ptr__->d).size)) {
        resize(__return_storage_ptr__,lVar9);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QByteArray::toPercentEncoding(const QByteArray &exclude, const QByteArray &include,
                                         char percent) const
{
    if (isNull())
        return QByteArray();    // preserve null
    if (isEmpty())
        return QByteArray(data(), 0);

    const auto contains = [](const QByteArray &view, char c) {
        // As view.contains(c), but optimised to bypass a lot of overhead:
        return view.size() > 0 && memchr(view.data(), c, view.size()) != nullptr;
    };

    QByteArray result = *this;
    char *output = nullptr;
    qsizetype length = 0;

    for (unsigned char c : *this) {
        if (char(c) != percent
            && ((c >= 0x61 && c <= 0x7A) // ALPHA
                || (c >= 0x41 && c <= 0x5A) // ALPHA
                || (c >= 0x30 && c <= 0x39) // DIGIT
                || c == 0x2D // -
                || c == 0x2E // .
                || c == 0x5F // _
                || c == 0x7E // ~
                || contains(exclude, c))
            && !contains(include, c)) {
            if (output)
                output[length] = c;
            ++length;
        } else {
            if (!output) {
                // detach now
                result.resize(size() * 3); // worst case
                output = result.data();
            }
            output[length++] = percent;
            output[length++] = QtMiscUtils::toHexUpper((c & 0xf0) >> 4);
            output[length++] = QtMiscUtils::toHexUpper(c & 0xf);
        }
    }
    if (output)
        result.truncate(length);

    return result;
}